

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Embed *value)

{
  uint *puVar1;
  BinCompat *pBVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  ssize_t sVar6;
  reference pvVar7;
  size_t in_RCX;
  uint *pos;
  void *in_RDX;
  uint *puVar8;
  void *__buf;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  Type type;
  Type local_49;
  char *local_48;
  ulong local_40;
  uint *local_38;
  
  pos = (uint *)(this->reader).cur_;
  sVar6 = BinaryReader::read(&this->reader,(int)value,in_RDX,in_RCX);
  if ((char)sVar6 == '\0') {
    pcVar9 = "reader.read(value.name)";
  }
  else {
    puVar8 = (uint *)(this->reader).cur_;
    puVar1 = (uint *)(this->reader).cap_;
    pos = puVar8 + 1;
    if (puVar1 < pos) {
      pcVar9 = "reader.read(size)";
      pos = puVar8;
    }
    else {
      uVar11 = (ulong)*puVar8;
      (this->reader).cur_ = (char *)pos;
      puVar8 = (uint *)((long)puVar8 + 6);
      if (puVar8 <= puVar1) {
        pcVar9 = (this->reader).beg_;
        uVar13 = (ulong)(ushort)*pos;
        (this->reader).cur_ = (char *)puVar8;
        pcVar10 = pcVar9;
        local_38 = pos;
        if (uVar13 != 0) {
          local_48 = pcVar9;
          local_40 = uVar11;
          do {
            pvVar7 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                               (&value->items);
            pcVar9 = (this->reader).cur_;
            sVar6 = BinaryReader::read(&this->reader,(int)pvVar7,__buf,(size_t)pos);
            if ((char)sVar6 == '\0') {
              pcVar10 = "reader.read(name)";
LAB_00118343:
              bVar5 = fail_msg(this,pcVar10,pcVar9);
              goto LAB_0011834e;
            }
            pcVar9 = (this->reader).cur_;
            if ((this->reader).cap_ < pcVar9 + 1) {
LAB_0011832a:
              pcVar10 = "reader.read(type)";
              goto LAB_00118343;
            }
            cVar4 = *pcVar9;
            (this->reader).cur_ = pcVar9 + 1;
            pBVar2 = (this->reader).compat_;
            cVar4 = (**(code **)(*(long *)pBVar2 + 0x10))(pBVar2,cVar4,&local_49);
            if (cVar4 == '\0') goto LAB_0011832a;
            pcVar9 = (this->reader).cur_;
            bVar3 = read_value_of(this,&pvVar7->value,local_49);
            if (!bVar3) {
              pcVar10 = "read_value_of(item, type)";
              goto LAB_00118343;
            }
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
          pcVar9 = (this->reader).beg_;
          puVar8 = (uint *)(this->reader).cur_;
          pcVar10 = local_48;
          uVar11 = local_40;
        }
        bVar5 = (byte)pos;
        lVar12 = (long)local_38 + (uVar11 - (long)pcVar10);
        if ((long)puVar8 - (long)pcVar9 != lVar12) {
          bVar5 = fail_msg(this,"reader.position() == position + size",(char *)puVar8);
        }
        bVar5 = (long)puVar8 - (long)pcVar9 == lVar12 | bVar5;
LAB_0011834e:
        return (bool)(bVar5 & 1);
      }
      pcVar9 = "reader.read(count)";
    }
  }
  bVar3 = fail_msg(this,pcVar9,(char *)pos);
  return bVar3;
}

Assistant:

bool read_value_visit(Embed& value) noexcept {
            uint32_t size = 0;
            uint16_t count = 0;
            bin_assert(reader.read(value.name));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = value.items.emplace_back();
                Type type;
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }